

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFObjectParser.cpp
# Opt level: O1

PDFObject * __thiscall PDFObjectParser::ParseArray(PDFObjectParser *this)

{
  size_t *psVar1;
  bool bVar2;
  EStatusCode EVar3;
  int iVar4;
  PDFArray *this_00;
  _Node *p_Var5;
  Trace *pTVar6;
  int iVar7;
  bool bVar8;
  string token;
  RefCountPtr<PDFObject> anObject;
  long *local_80 [2];
  long local_70 [2];
  string local_60;
  RefCountPtr<PDFObject> local_40;
  
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  local_60._M_string_length = 0;
  local_60.field_2._M_local_buf[0] = '\0';
  EVar3 = IncreaseAndCheckDepth(this);
  if (EVar3 == eSuccess) {
    this_00 = (PDFArray *)operator_new(0x60);
    PDFArray::PDFArray(this_00);
    bVar8 = false;
    iVar7 = 0;
    while( true ) {
      bVar2 = GetNextToken(this,&local_60);
      if (!bVar2 || iVar7 != 0) break;
      if (scRightSquare_abi_cxx11_._M_string_length == local_60._M_string_length) {
        if (scRightSquare_abi_cxx11_._M_string_length == 0) {
          bVar8 = true;
        }
        else {
          iVar4 = bcmp(scRightSquare_abi_cxx11_._M_dataplus._M_p,local_60._M_dataplus._M_p,
                       scRightSquare_abi_cxx11_._M_string_length);
          bVar8 = iVar4 == 0;
        }
      }
      else {
        bVar8 = false;
      }
      if (bVar8) break;
      p_Var5 = std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
               _M_create_node<std::__cxx11::string_const&>
                         ((list<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                          &this->mTokenBuffer,&local_60);
      std::__detail::_List_node_base::_M_hook(&p_Var5->super__List_node_base);
      psVar1 = &(this->mTokenBuffer).
                super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
      local_40.mValue = ParseNewObject(this);
      local_40._vptr_RefCountPtr = (_func_int **)&PTR__RefCountPtr_003a9780;
      if (local_40.mValue == (PDFObject *)0x0) {
        pTVar6 = Trace::DefaultTrace();
        std::__cxx11::string::substr((ulong)local_80,(ulong)&local_60);
        Trace::TraceToLog(pTVar6,
                          "PDFObjectParser::ParseArray, failure to parse array, failed to parse a member object. token = %s"
                          ,local_80[0]);
        if (local_80[0] != local_70) {
          operator_delete(local_80[0],local_70[0] + 1);
        }
        iVar7 = -1;
      }
      else {
        iVar7 = 0;
        PDFArray::AppendObject(this_00,local_40.mValue);
      }
      RefCountPtr<PDFObject>::~RefCountPtr(&local_40);
    }
    EVar3 = DecreaseAndCheckDepth(this);
    if ((bool)(bVar8 & (EVar3 == eSuccess && iVar7 == 0))) goto LAB_001d4dc5;
    (*(this_00->super_PDFObject).super_RefCountObject._vptr_RefCountObject[1])(this_00);
    pTVar6 = Trace::DefaultTrace();
    std::__cxx11::string::substr((ulong)local_80,(ulong)&local_60);
    Trace::TraceToLog(pTVar6,
                      "PDFObjectParser::ParseArray, failure to parse array, didn\'t find end of array or failure to parse array member object. token = %s"
                      ,local_80[0]);
    if (local_80[0] != local_70) {
      operator_delete(local_80[0],local_70[0] + 1);
    }
  }
  this_00 = (PDFArray *)0x0;
LAB_001d4dc5:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,
                    CONCAT71(local_60.field_2._M_allocated_capacity._1_7_,
                             local_60.field_2._M_local_buf[0]) + 1);
  }
  return &this_00->super_PDFObject;
}

Assistant:

PDFObject* PDFObjectParser::ParseArray()
{
	PDFArray* anArray;
	bool arrayEndEncountered = false;
	std::string token;
	EStatusCode status = PDFHummus::eSuccess;

	if(IncreaseAndCheckDepth() != eSuccess)
		return NULL;

	anArray = new PDFArray();

	// easy one. just loop till you get to a closing bracket token and recurse
	while(GetNextToken(token) && PDFHummus::eSuccess == status)
	{
		arrayEndEncountered = (scRightSquare == token);
		if(arrayEndEncountered)
			break;

		ReturnTokenToBuffer(token);
		RefCountPtr<PDFObject> anObject(ParseNewObject());
		if(!anObject)
		{
			status = PDFHummus::eFailure;
			TRACE_LOG1("PDFObjectParser::ParseArray, failure to parse array, failed to parse a member object. token = %s",token.substr(0, MAX_TRACE_SIZE - 200).c_str());
		}
		else
		{
			anArray->AppendObject(anObject.GetPtr());
		}
	}

	if(DecreaseAndCheckDepth() != eSuccess)
		status = eFailure;

	if(arrayEndEncountered && PDFHummus::eSuccess == status)
	{
		return anArray;
	}
	else
	{
		delete anArray;
		TRACE_LOG1("PDFObjectParser::ParseArray, failure to parse array, didn't find end of array or failure to parse array member object. token = %s",token.substr(0, MAX_TRACE_SIZE - 200).c_str());
		return NULL;
	}
}